

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

const_iterator __thiscall GainBuckets::addCell(GainBuckets *this,int gain,uint cell)

{
  Bucket *pBVar1;
  value_type_conflict local_14;
  
  this->num_elems_ = this->num_elems_ + 1;
  if (this->best_gain_ < gain) {
    this->best_gain_ = gain;
  }
  pBVar1 = operator[][abi_cxx11_(this,gain);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_front(pBVar1,&local_14);
  pBVar1 = operator[][abi_cxx11_(this,gain);
  return (const_iterator)
         (pBVar1->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
         super__List_node_base._M_next;
}

Assistant:

GainBuckets::Bucket::const_iterator GainBuckets::addCell(int gain, unsigned cell) {
  ++num_elems_;
  if (gain > best_gain_)
    best_gain_ = gain;
  (*this)[gain].push_front(cell);
  return (*this)[gain].cbegin();
}